

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O0

void cfl_luma_subsampling_444_lbd_ssse3
               (uint8_t *input,int input_stride,uint16_t *pred_buf_q3,int width,int height)

{
  longlong lVar1;
  longlong lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int in_ECX;
  undefined8 *in_RDX;
  int in_ESI;
  __m128i *in_RDI;
  int in_R8D;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar8 [16];
  __m128i row_1_hi;
  __m128i row_1_lo;
  __m128i row_1;
  __m128i row_hi;
  __m128i row_lo;
  __m128i row_3;
  __m128i row_2;
  __m128i row;
  __m128i *end;
  __m128i *pred_buf_m128i;
  int luma_stride;
  __m128i zeros;
  undefined1 auStack_2f0 [4];
  undefined1 uStack_2ec;
  undefined1 uStack_2ea;
  undefined1 auStack_2e0 [4];
  undefined1 uStack_2dc;
  undefined1 uStack_2da;
  undefined8 *local_2c8;
  __m128i *local_290;
  undefined8 local_268;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  byte local_178;
  undefined1 uStack_177;
  undefined1 uStack_176;
  undefined1 uStack_175;
  byte bStack_174;
  undefined1 uStack_173;
  undefined1 uStack_172;
  undefined1 uStack_171;
  byte local_158;
  undefined1 uStack_157;
  undefined1 uStack_156;
  undefined1 uStack_155;
  byte bStack_154;
  undefined1 uStack_153;
  undefined1 uStack_152;
  undefined1 uStack_151;
  undefined1 uStack_137;
  undefined1 uStack_136;
  undefined1 uStack_135;
  byte bStack_134;
  undefined1 uStack_133;
  undefined1 uStack_132;
  undefined1 uStack_131;
  undefined1 uStack_117;
  undefined1 uStack_116;
  undefined1 uStack_115;
  byte bStack_114;
  undefined1 uStack_113;
  undefined1 uStack_112;
  undefined1 uStack_111;
  byte bStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  byte bStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  byte bStack_10;
  undefined1 uStack_f;
  undefined1 uStack_e;
  undefined1 uStack_d;
  byte bStack_c;
  undefined1 uStack_b;
  undefined1 uStack_a;
  undefined1 uStack_9;
  
  local_2c8 = in_RDX;
  local_290 = in_RDI;
  do {
    if (in_ECX == 4) {
      _mm_loadh_epi32(local_290);
      uStack_117 = (undefined1)((ulong)extraout_XMM0_Qa >> 8);
      uStack_116 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x10);
      uStack_115 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x18);
      bStack_114 = (byte)((ulong)extraout_XMM0_Qa >> 0x20);
      uStack_113 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x28);
      uStack_112 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x30);
      uStack_111 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x38);
      auVar7[1] = 0;
      auVar7[0] = (byte)extraout_XMM0_Qa;
      auVar7[2] = uStack_117;
      auVar7[3] = 0;
      auVar7[4] = uStack_116;
      auVar7[5] = 0;
      auVar7[6] = uStack_115;
      auVar7[7] = 0;
      _auStack_2e0 = (uint6)CONCAT14(uStack_112,
                                     CONCAT13(0,CONCAT12(uStack_113,CONCAT11(0,bStack_114))));
      _auStack_2e0 = CONCAT16(uStack_111,_auStack_2e0);
      auVar7._8_7_ = _auStack_2e0;
      auVar7[0xf] = 0;
      auVar8 = psllw(auVar7,ZEXT416(3));
      local_268 = auVar8._0_8_;
      *local_2c8 = local_268;
    }
    else if (in_ECX == 8) {
      lVar1 = (*local_290)[0];
      uStack_137 = (undefined1)((ulong)lVar1 >> 8);
      uStack_136 = (undefined1)((ulong)lVar1 >> 0x10);
      uStack_135 = (undefined1)((ulong)lVar1 >> 0x18);
      bStack_134 = (byte)((ulong)lVar1 >> 0x20);
      uStack_133 = (undefined1)((ulong)lVar1 >> 0x28);
      uStack_132 = (undefined1)((ulong)lVar1 >> 0x30);
      uStack_131 = (undefined1)((ulong)lVar1 >> 0x38);
      auVar6[1] = 0;
      auVar6[0] = (byte)lVar1;
      auVar6[2] = uStack_137;
      auVar6[3] = 0;
      auVar6[4] = uStack_136;
      auVar6[5] = 0;
      auVar6[6] = uStack_135;
      auVar6[7] = 0;
      _auStack_2f0 = (uint6)CONCAT14(uStack_132,
                                     CONCAT13(0,CONCAT12(uStack_133,CONCAT11(0,bStack_134))));
      _auStack_2f0 = CONCAT16(uStack_131,_auStack_2f0);
      auVar6._8_7_ = _auStack_2f0;
      auVar6[0xf] = 0;
      auVar8 = psllw(auVar6,ZEXT416(3));
      local_1b8 = auVar8._0_8_;
      uStack_1b0 = auVar8._8_8_;
      *local_2c8 = local_1b8;
      local_2c8[1] = uStack_1b0;
    }
    else {
      lVar1 = (*local_290)[0];
      lVar2 = (*local_290)[1];
      local_158 = (byte)lVar1;
      uStack_157 = (undefined1)((ulong)lVar1 >> 8);
      uStack_156 = (undefined1)((ulong)lVar1 >> 0x10);
      uStack_155 = (undefined1)((ulong)lVar1 >> 0x18);
      bStack_154 = (byte)((ulong)lVar1 >> 0x20);
      uStack_153 = (undefined1)((ulong)lVar1 >> 0x28);
      uStack_152 = (undefined1)((ulong)lVar1 >> 0x30);
      uStack_151 = (undefined1)((ulong)lVar1 >> 0x38);
      bStack_10 = (byte)lVar2;
      uStack_f = (undefined1)((ulong)lVar2 >> 8);
      uStack_e = (undefined1)((ulong)lVar2 >> 0x10);
      uStack_d = (undefined1)((ulong)lVar2 >> 0x18);
      bStack_c = (byte)((ulong)lVar2 >> 0x20);
      uStack_b = (undefined1)((ulong)lVar2 >> 0x28);
      uStack_a = (undefined1)((ulong)lVar2 >> 0x30);
      uStack_9 = (undefined1)((ulong)lVar2 >> 0x38);
      auVar5[1] = 0;
      auVar5[0] = local_158;
      auVar5[2] = uStack_157;
      auVar5[3] = 0;
      auVar5[4] = uStack_156;
      auVar5[5] = 0;
      auVar5[6] = uStack_155;
      auVar5[7] = 0;
      auVar5[9] = 0;
      auVar5[8] = bStack_154;
      auVar5[10] = uStack_153;
      auVar5[0xb] = 0;
      auVar5[0xc] = uStack_152;
      auVar5[0xd] = 0;
      auVar5[0xe] = uStack_151;
      auVar5[0xf] = 0;
      auVar8 = psllw(auVar5,ZEXT416(3));
      local_1d8 = auVar8._0_8_;
      uStack_1d0 = auVar8._8_8_;
      *local_2c8 = local_1d8;
      local_2c8[1] = uStack_1d0;
      auVar8[1] = 0;
      auVar8[0] = bStack_10;
      auVar8[2] = uStack_f;
      auVar8[3] = 0;
      auVar8[4] = uStack_e;
      auVar8[5] = 0;
      auVar8[6] = uStack_d;
      auVar8[7] = 0;
      auVar8[9] = 0;
      auVar8[8] = bStack_c;
      auVar8[10] = uStack_b;
      auVar8[0xb] = 0;
      auVar8[0xc] = uStack_a;
      auVar8[0xd] = 0;
      auVar8[0xe] = uStack_9;
      auVar8[0xf] = 0;
      auVar8 = psllw(auVar8,ZEXT416(3));
      local_1f8 = auVar8._0_8_;
      uStack_1f0 = auVar8._8_8_;
      local_2c8[2] = local_1f8;
      local_2c8[3] = uStack_1f0;
      if (in_ECX == 0x20) {
        lVar1 = local_290[1][0];
        lVar2 = local_290[1][1];
        local_178 = (byte)lVar1;
        uStack_177 = (undefined1)((ulong)lVar1 >> 8);
        uStack_176 = (undefined1)((ulong)lVar1 >> 0x10);
        uStack_175 = (undefined1)((ulong)lVar1 >> 0x18);
        bStack_174 = (byte)((ulong)lVar1 >> 0x20);
        uStack_173 = (undefined1)((ulong)lVar1 >> 0x28);
        uStack_172 = (undefined1)((ulong)lVar1 >> 0x30);
        uStack_171 = (undefined1)((ulong)lVar1 >> 0x38);
        bStack_30 = (byte)lVar2;
        uStack_2f = (undefined1)((ulong)lVar2 >> 8);
        uStack_2e = (undefined1)((ulong)lVar2 >> 0x10);
        uStack_2d = (undefined1)((ulong)lVar2 >> 0x18);
        bStack_2c = (byte)((ulong)lVar2 >> 0x20);
        uStack_2b = (undefined1)((ulong)lVar2 >> 0x28);
        uStack_2a = (undefined1)((ulong)lVar2 >> 0x30);
        uStack_29 = (undefined1)((ulong)lVar2 >> 0x38);
        auVar4[1] = 0;
        auVar4[0] = local_178;
        auVar4[2] = uStack_177;
        auVar4[3] = 0;
        auVar4[4] = uStack_176;
        auVar4[5] = 0;
        auVar4[6] = uStack_175;
        auVar4[7] = 0;
        auVar4[9] = 0;
        auVar4[8] = bStack_174;
        auVar4[10] = uStack_173;
        auVar4[0xb] = 0;
        auVar4[0xc] = uStack_172;
        auVar4[0xd] = 0;
        auVar4[0xe] = uStack_171;
        auVar4[0xf] = 0;
        auVar8 = psllw(auVar4,ZEXT416(3));
        local_218 = auVar8._0_8_;
        uStack_210 = auVar8._8_8_;
        local_2c8[4] = local_218;
        local_2c8[5] = uStack_210;
        auVar3[1] = 0;
        auVar3[0] = bStack_30;
        auVar3[2] = uStack_2f;
        auVar3[3] = 0;
        auVar3[4] = uStack_2e;
        auVar3[5] = 0;
        auVar3[6] = uStack_2d;
        auVar3[7] = 0;
        auVar3[9] = 0;
        auVar3[8] = bStack_2c;
        auVar3[10] = uStack_2b;
        auVar3[0xb] = 0;
        auVar3[0xc] = uStack_2a;
        auVar3[0xd] = 0;
        auVar3[0xe] = uStack_29;
        auVar3[0xf] = 0;
        auVar8 = psllw(auVar3,ZEXT416(3));
        local_238 = auVar8._0_8_;
        uStack_230 = auVar8._8_8_;
        local_2c8[6] = local_238;
        local_2c8[7] = uStack_230;
      }
    }
    local_290 = (__m128i *)((long)*local_290 + (long)in_ESI);
    local_2c8 = local_2c8 + 8;
  } while (local_2c8 < in_RDX + (long)(in_R8D << 2) * 2);
  return;
}

Assistant:

static inline void cfl_luma_subsampling_444_lbd_ssse3(const uint8_t *input,
                                                      int input_stride,
                                                      uint16_t *pred_buf_q3,
                                                      int width, int height) {
  const __m128i zeros = _mm_setzero_si128();
  const int luma_stride = input_stride;
  __m128i *pred_buf_m128i = (__m128i *)pred_buf_q3;
  const __m128i *end = pred_buf_m128i + height * CFL_BUF_LINE_I128;
  do {
    if (width == 4) {
      __m128i row = _mm_loadh_epi32((__m128i *)input);
      row = _mm_unpacklo_epi8(row, zeros);
      _mm_storel_epi64(pred_buf_m128i, _mm_slli_epi16(row, 3));
    } else if (width == 8) {
      __m128i row = _mm_loadl_epi64((__m128i *)input);
      row = _mm_unpacklo_epi8(row, zeros);
      _mm_storeu_si128(pred_buf_m128i, _mm_slli_epi16(row, 3));
    } else {
      __m128i row = _mm_loadu_si128((__m128i *)input);
      const __m128i row_lo = _mm_unpacklo_epi8(row, zeros);
      const __m128i row_hi = _mm_unpackhi_epi8(row, zeros);
      _mm_storeu_si128(pred_buf_m128i, _mm_slli_epi16(row_lo, 3));
      _mm_storeu_si128(pred_buf_m128i + 1, _mm_slli_epi16(row_hi, 3));
      if (width == 32) {
        __m128i row_1 = _mm_loadu_si128(((__m128i *)input) + 1);
        const __m128i row_1_lo = _mm_unpacklo_epi8(row_1, zeros);
        const __m128i row_1_hi = _mm_unpackhi_epi8(row_1, zeros);
        _mm_storeu_si128(pred_buf_m128i + 2, _mm_slli_epi16(row_1_lo, 3));
        _mm_storeu_si128(pred_buf_m128i + 3, _mm_slli_epi16(row_1_hi, 3));
      }
    }
    input += luma_stride;
    pred_buf_m128i += CFL_BUF_LINE_I128;
  } while (pred_buf_m128i < end);
}